

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int uv_tcp_open(uv_tcp_t *handle,uv_os_sock_t sock)

{
  int err;
  uv_os_sock_t sock_local;
  uv_tcp_t *handle_local;
  
  handle_local._4_4_ = uv__nonblock_ioctl(sock,1);
  if (handle_local._4_4_ == 0) {
    handle_local._4_4_ = uv__stream_open((uv_stream_t *)handle,sock,0x60);
  }
  return handle_local._4_4_;
}

Assistant:

int uv_tcp_open(uv_tcp_t* handle, uv_os_sock_t sock) {
  int err;

  err = uv__nonblock(sock, 1);
  if (err)
    return err;

  return uv__stream_open((uv_stream_t*)handle,
                         sock,
                         UV_STREAM_READABLE | UV_STREAM_WRITABLE);
}